

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uefitool_main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  UEFIToolApplication a;
  int local_24;
  UEFIToolApplication local_20;
  
  local_24 = argc;
  UEFIToolApplication::UEFIToolApplication(&local_20,&local_24,argv);
  iVar1 = UEFIToolApplication::startup(&local_20);
  UEFIToolApplication::~UEFIToolApplication(&local_20);
  return iVar1;
}

Assistant:

int main(int argc, char *argv[])
{
    UEFIToolApplication a(argc, argv);
    return a.startup();
}